

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::
     TupleMatches<std::tuple<testing::Matcher<absl::lts_20250127::LogEntry_const&>>,std::tuple<absl::lts_20250127::LogEntry_const&>>
               (tuple<testing::Matcher<const_absl::lts_20250127::LogEntry_&>_> *matcher_tuple,
               tuple<const_absl::lts_20250127::LogEntry_&> *value_tuple)

{
  bool bVar1;
  tuple<const_absl::lts_20250127::LogEntry_&> *value_tuple_local;
  tuple<testing::Matcher<const_absl::lts_20250127::LogEntry_&>_> *matcher_tuple_local;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<absl::lts_20250127::LogEntry_const&>>,std::tuple<absl::lts_20250127::LogEntry_const&>>
                    (matcher_tuple,value_tuple);
  return bVar1;
}

Assistant:

bool TupleMatches(const MatcherTuple& matcher_tuple,
                  const ValueTuple& value_tuple) {
  // Makes sure that matcher_tuple and value_tuple have the same
  // number of fields.
  static_assert(std::tuple_size<MatcherTuple>::value ==
                    std::tuple_size<ValueTuple>::value,
                "matcher and value have different numbers of fields");
  return TuplePrefix<std::tuple_size<ValueTuple>::value>::Matches(matcher_tuple,
                                                                  value_tuple);
}